

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

char * curl_url_strerror(CURLUcode error)

{
  char *pcStack_10;
  CURLUcode error_local;
  
  switch(error) {
  case CURLUE_OK:
    pcStack_10 = "No error";
    break;
  case CURLUE_BAD_HANDLE:
    pcStack_10 = "An invalid CURLU pointer was passed as argument";
    break;
  case CURLUE_BAD_PARTPOINTER:
    pcStack_10 = "An invalid \'part\' argument was passed as argument";
    break;
  case CURLUE_MALFORMED_INPUT:
    pcStack_10 = "Malformed input to a URL function";
    break;
  case CURLUE_BAD_PORT_NUMBER:
    pcStack_10 = "Port number was not a decimal number between 0 and 65535";
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
    pcStack_10 = "Unsupported URL scheme";
    break;
  case CURLUE_URLDECODE:
    pcStack_10 = "URL decode error, most likely because of rubbish in the input";
    break;
  case CURLUE_OUT_OF_MEMORY:
    pcStack_10 = "A memory function failed";
    break;
  case CURLUE_USER_NOT_ALLOWED:
    pcStack_10 = "Credentials was passed in the URL when prohibited";
    break;
  case CURLUE_UNKNOWN_PART:
    pcStack_10 = "An unknown part ID was passed to a URL API function";
    break;
  case CURLUE_NO_SCHEME:
    pcStack_10 = "No scheme part in the URL";
    break;
  case CURLUE_NO_USER:
    pcStack_10 = "No user part in the URL";
    break;
  case CURLUE_NO_PASSWORD:
    pcStack_10 = "No password part in the URL";
    break;
  case CURLUE_NO_OPTIONS:
    pcStack_10 = "No options part in the URL";
    break;
  case CURLUE_NO_HOST:
    pcStack_10 = "No host part in the URL";
    break;
  case CURLUE_NO_PORT:
    pcStack_10 = "No port part in the URL";
    break;
  case CURLUE_NO_QUERY:
    pcStack_10 = "No query part in the URL";
    break;
  case CURLUE_NO_FRAGMENT:
    pcStack_10 = "No fragment part in the URL";
    break;
  case CURLUE_NO_ZONEID:
    pcStack_10 = "No zoneid part in the URL";
    break;
  case CURLUE_BAD_FILE_URL:
    pcStack_10 = "Bad file:// URL";
    break;
  case CURLUE_BAD_FRAGMENT:
    pcStack_10 = "Bad fragment";
    break;
  case CURLUE_BAD_HOSTNAME:
    pcStack_10 = "Bad hostname";
    break;
  case CURLUE_BAD_IPV6:
    pcStack_10 = "Bad IPv6 address";
    break;
  case CURLUE_BAD_LOGIN:
    pcStack_10 = "Bad login part";
    break;
  case CURLUE_BAD_PASSWORD:
    pcStack_10 = "Bad password";
    break;
  case CURLUE_BAD_PATH:
    pcStack_10 = "Bad path";
    break;
  case CURLUE_BAD_QUERY:
    pcStack_10 = "Bad query";
    break;
  case CURLUE_BAD_SCHEME:
    pcStack_10 = "Bad scheme";
    break;
  case CURLUE_BAD_SLASHES:
    pcStack_10 = "Unsupported number of slashes following scheme";
    break;
  case CURLUE_BAD_USER:
    pcStack_10 = "Bad user";
    break;
  case CURLUE_LACKS_IDN:
    pcStack_10 = "libcurl lacks IDN support";
    break;
  case CURLUE_TOO_LARGE:
    pcStack_10 = "A value or data field is larger than allowed";
    break;
  case CURLUE_LAST:
  default:
    pcStack_10 = "CURLUcode unknown";
  }
  return pcStack_10;
}

Assistant:

const char *
curl_url_strerror(CURLUcode error)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  switch(error) {
  case CURLUE_OK:
    return "No error";

  case CURLUE_BAD_HANDLE:
    return "An invalid CURLU pointer was passed as argument";

  case CURLUE_BAD_PARTPOINTER:
    return "An invalid 'part' argument was passed as argument";

  case CURLUE_MALFORMED_INPUT:
    return "Malformed input to a URL function";

  case CURLUE_BAD_PORT_NUMBER:
    return "Port number was not a decimal number between 0 and 65535";

  case CURLUE_UNSUPPORTED_SCHEME:
    return "Unsupported URL scheme";

  case CURLUE_URLDECODE:
    return "URL decode error, most likely because of rubbish in the input";

  case CURLUE_OUT_OF_MEMORY:
    return "A memory function failed";

  case CURLUE_USER_NOT_ALLOWED:
    return "Credentials was passed in the URL when prohibited";

  case CURLUE_UNKNOWN_PART:
    return "An unknown part ID was passed to a URL API function";

  case CURLUE_NO_SCHEME:
    return "No scheme part in the URL";

  case CURLUE_NO_USER:
    return "No user part in the URL";

  case CURLUE_NO_PASSWORD:
    return "No password part in the URL";

  case CURLUE_NO_OPTIONS:
    return "No options part in the URL";

  case CURLUE_NO_HOST:
    return "No host part in the URL";

  case CURLUE_NO_PORT:
    return "No port part in the URL";

  case CURLUE_NO_QUERY:
    return "No query part in the URL";

  case CURLUE_NO_FRAGMENT:
    return "No fragment part in the URL";

  case CURLUE_NO_ZONEID:
    return "No zoneid part in the URL";

  case CURLUE_BAD_LOGIN:
    return "Bad login part";

  case CURLUE_BAD_IPV6:
    return "Bad IPv6 address";

  case CURLUE_BAD_HOSTNAME:
    return "Bad hostname";

  case CURLUE_BAD_FILE_URL:
    return "Bad file:// URL";

  case CURLUE_BAD_SLASHES:
    return "Unsupported number of slashes following scheme";

  case CURLUE_BAD_SCHEME:
    return "Bad scheme";

  case CURLUE_BAD_PATH:
    return "Bad path";

  case CURLUE_BAD_FRAGMENT:
    return "Bad fragment";

  case CURLUE_BAD_QUERY:
    return "Bad query";

  case CURLUE_BAD_PASSWORD:
    return "Bad password";

  case CURLUE_BAD_USER:
    return "Bad user";

  case CURLUE_LACKS_IDN:
    return "libcurl lacks IDN support";

  case CURLUE_TOO_LARGE:
    return "A value or data field is larger than allowed";

  case CURLUE_LAST:
    break;
  }

  return "CURLUcode unknown";
#else
  if(error == CURLUE_OK)
    return "No error";
  else
    return "Error";
#endif
}